

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_ComputeCanonical2(sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit)

{
  int iVar1;
  int iVar2;
  int *begin;
  int *end;
  int local_3c;
  int status;
  int iLit;
  int k;
  int i;
  int nBTLimit_local;
  Vec_Int_t *vTemp_local;
  Vec_Int_t *vLits_local;
  sat_solver *pSat_local;
  
  local_3c = 0;
  iLit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLits);
    if (iVar1 <= iLit) {
      if (local_3c == 1) {
        return 1;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0x26d,"int Bmc_ComputeCanonical2(sat_solver *, Vec_Int_t *, Vec_Int_t *, int)")
      ;
    }
    Vec_IntClear(vTemp);
    for (status = 0; status < iLit + 1; status = status + 1) {
      iVar1 = Vec_IntEntry(vLits,status);
      Vec_IntPush(vTemp,iVar1);
    }
    begin = Vec_IntArray(vTemp);
    end = Vec_IntLimit(vTemp);
    local_3c = sat_solver_solve(pSat,begin,end,(long)nBTLimit,0,0,0);
    if (local_3c == 0) break;
    if (local_3c != 1) {
      iVar1 = Vec_IntEntry(vLits,iLit);
      iVar2 = Abc_LitIsCompl(iVar1);
      if (iVar2 == 0) {
        return -1;
      }
      iVar1 = Abc_LitNot(iVar1);
      Vec_IntWriteEntry(vLits,iLit,iVar1);
      status = iLit;
      while( true ) {
        status = status + 1;
        iVar1 = Vec_IntSize(vLits);
        if (iVar1 <= status) break;
        iVar1 = Vec_IntEntry(vLits,status);
        iVar1 = Abc_LitRegular(iVar1);
        iVar1 = Abc_LitNot(iVar1);
        Vec_IntWriteEntry(vLits,status,iVar1);
      }
      iLit = iLit + -1;
    }
    iLit = iLit + 1;
  }
  return 0;
}

Assistant:

int Bmc_ComputeCanonical2( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit )
{
    int i, k, iLit, status = l_Undef;
    for ( i = 0; i < Vec_IntSize(vLits); i++ )
    {
        // copy the first i+1 literals
        Vec_IntClear( vTemp );
        Vec_IntForEachEntryStop( vLits, iLit, k, i+1 )
            Vec_IntPush( vTemp, iLit );
        // check if it satisfies the on-set
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return l_Undef;
        if ( status == l_True )
            continue;
        // if it is UNSAT, try the opposite literal
        iLit = Vec_IntEntry( vLits, i );
        // if literal is positive, there is no way to flip it
        if ( !Abc_LitIsCompl(iLit) )
            return l_False;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(iLit) );
        Vec_IntForEachEntryStart( vLits, iLit, k, i+1 )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(Abc_LitRegular(iLit)) );
        // recheck
        i--;
    }
    assert( status == l_True );
    return status;
}